

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O3

Token * __thiscall
wabt::WastLexer::GetHexNumberToken
          (Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  LiteralType literal_type;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  bVar2 = ReadHexNum(this);
  if (bVar2) {
    pbVar5 = (byte *)this->buffer_end_;
    pbVar4 = (byte *)this->cursor_;
    if ((pbVar4 < pbVar5) && (*pbVar4 == 0x2e)) {
      pbVar4 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar4;
      if (pbVar4 < pbVar5) {
        lVar8 = (ulong)*pbVar4 + 1;
      }
      else {
        lVar8 = 0;
      }
      token_type = First_Literal;
      if ((""[lVar8] & 4U) != 0) {
        bVar2 = ReadHexNum(this);
        if (!bVar2) goto LAB_0017d554;
        pbVar5 = (byte *)this->buffer_end_;
        pbVar4 = (byte *)this->cursor_;
      }
    }
    if ((pbVar4 < pbVar5) && ((*pbVar4 == 0x70 || (*pbVar4 == 0x50)))) {
      pbVar1 = pbVar4 + 1;
      this->cursor_ = (char *)pbVar1;
      if ((pbVar1 < pbVar5) && ((*pbVar1 == 0x2d || (*pbVar1 == 0x2b)))) {
        this->cursor_ = (char *)(pbVar4 + 2);
      }
      bVar2 = ReadNum(this);
      if (!bVar2) goto LAB_0017d554;
      pbVar5 = (byte *)this->buffer_end_;
      pbVar4 = (byte *)this->cursor_;
      token_type = First_Literal;
    }
    if (pbVar4 < pbVar5) {
      iVar3 = (int)pbVar4;
      iVar6 = 0;
      do {
        iVar7 = iVar6;
        if ((""[(ulong)*pbVar4 + 1] & 1U) == 0) break;
        pbVar4 = pbVar4 + 1;
        this->cursor_ = (char *)pbVar4;
        iVar6 = iVar6 + 1;
        iVar7 = (int)pbVar5 - iVar3;
      } while (pbVar4 != pbVar5);
      if (iVar7 != 0) goto LAB_0017d554;
    }
    if (token_type == First_Literal) {
      token_type = First_Literal;
      literal_type = Hexfloat;
    }
    else {
      literal_type = Int;
    }
    LiteralToken(__return_storage_ptr__,this,token_type,literal_type);
  }
  else {
LAB_0017d554:
    GetReservedToken(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetHexNumberToken(TokenType token_type) {
  if (ReadHexNum()) {
    if (MatchChar('.')) {
      token_type = TokenType::Float;
      if (IsHexDigit(PeekChar()) && !ReadHexNum()) {
        return GetReservedToken();
      }
    }
    if (MatchChar('p') || MatchChar('P')) {
      token_type = TokenType::Float;
      ReadSign();
      if (!ReadNum()) {
        return GetReservedToken();
      }
    }
    if (NoTrailingReservedChars()) {
      if (token_type == TokenType::Float) {
        return LiteralToken(token_type, LiteralType::Hexfloat);
      } else {
        return LiteralToken(token_type, LiteralType::Int);
      }
    }
  }
  return GetReservedToken();
}